

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ReduceLogSumLayerParams::ReduceLogSumLayerParams
          (ReduceLogSumLayerParams *this,ReduceLogSumLayerParams *from)

{
  int new_size;
  void *pvVar1;
  bool bVar2;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ReduceLogSumLayerParams_0042dcd8
  ;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->axes_).current_size_ = 0;
  (this->axes_).total_size_ = 0;
  (this->axes_).rep_ = (Rep *)0x0;
  new_size = (from->axes_).current_size_;
  if (new_size != 0) {
    google::protobuf::RepeatedField<long>::Reserve(&this->axes_,new_size);
    memcpy(((this->axes_).rep_)->elements,((from->axes_).rep_)->elements,
           (long)(from->axes_).current_size_ << 3);
    (this->axes_).current_size_ = (from->axes_).current_size_;
  }
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  bVar2 = from->reduceall_;
  this->keepdims_ = from->keepdims_;
  this->reduceall_ = bVar2;
  return;
}

Assistant:

ReduceLogSumLayerParams::ReduceLogSumLayerParams(const ReduceLogSumLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      axes_(from.axes_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&keepdims_, &from.keepdims_,
    reinterpret_cast<char*>(&reduceall_) -
    reinterpret_cast<char*>(&keepdims_) + sizeof(reduceall_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ReduceLogSumLayerParams)
}